

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall Liby::Buffer::append(Buffer *this,char *buf,off_t len)

{
  char *pcVar1;
  off_t oVar2;
  off_t oVar3;
  off_t oVar4;
  Buffer local_40;
  
  if ((buf != (char *)0x0) && (0 < len)) {
    if (this->leftIndex_ == this->rightIndex_) {
      Buffer(&local_40,buf,len);
      pcVar1 = this->buffer_;
      this->buffer_ = local_40.buffer_;
      oVar2 = this->leftIndex_;
      oVar3 = this->rightIndex_;
      this->leftIndex_ = local_40.leftIndex_;
      this->rightIndex_ = local_40.rightIndex_;
      oVar4 = this->capacity_;
      this->capacity_ = local_40.capacity_;
      local_40.buffer_ = pcVar1;
      local_40.leftIndex_ = oVar2;
      local_40.rightIndex_ = oVar3;
      local_40.capacity_ = oVar4;
      resetBuffer(&local_40);
    }
    else {
      if (this->capacity_ - this->rightIndex_ < len) {
        oVar4 = size(this);
        if (this->capacity_ < oVar4 + len) {
          oVar4 = size(this);
          reserve(this,oVar4 + len + this->leftIndex_);
        }
        else {
          forward(this,0);
        }
      }
      memcpy(this->buffer_ + this->rightIndex_,buf,len);
      this->rightIndex_ = this->rightIndex_ + len;
    }
    return;
  }
  __assert_fail("buf && len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                ,0x6e,"void Liby::Buffer::append(const char *, off_t)");
}

Assistant:

void Buffer::append(const char *buf, off_t len) {
    assert(buf && len > 0);
    if(empty()) {
        Buffer buffer(buf, len);
        swap(buffer);
        return;
    }
    if (capacity_ - rightIndex_ >= len) {
        ;
    } else if (len + size() <= capacity_) {
        forward();
    } else {
        off_t minSize = size() + len + leftIndex_;
        reserve(minSize);
    }
    safeAppend(buf, len);
}